

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Insert(SQArray *this,SQInteger idx,SQObject *val)

{
  SQUnsignedInteger SVar1;
  sqvector<SQObjectPtr> *in_RDX;
  SQObjectPtr *in_RSI;
  long in_RDI;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQObjectValue in_stack_ffffffffffffffd8;
  
  if ((-1 < (long)in_RSI) &&
     (SVar1 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 0x30)),
     (long)in_RSI <= (long)SVar1)) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd0,(SQObject *)in_RDX);
    sqvector<SQObjectPtr>::insert
              (in_RDX,in_stack_ffffffffffffffd8.nInteger,in_stack_ffffffffffffffd0);
    ::SQObjectPtr::~SQObjectPtr(in_RSI);
    return true;
  }
  return false;
}

Assistant:

bool Insert(SQInteger idx,const SQObject &val){
        if(idx < 0 || idx > (SQInteger)_values.size())
            return false;
        _values.insert(idx,val);
        return true;
    }